

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  uint uVar1;
  int16 *piVar2;
  uint16 *puVar3;
  undefined8 uVar4;
  glist_t pgVar5;
  int iVar6;
  int32 iVar7;
  int iVar8;
  mdef_t *pmVar9;
  FILE *__stream;
  char *pcVar10;
  hash_table_t *phVar11;
  ciphone_t *pcVar12;
  phone_t *ppVar13;
  uint16 **ppuVar14;
  ph_lc_t ***ppppVar15;
  char *pcVar16;
  long lVar17;
  int16 *piVar18;
  void *pvVar19;
  glist_t g;
  int16 iVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int16 *piVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint size;
  word_posn_t wpos;
  uint uVar28;
  long lVar29;
  void *val;
  size_t len;
  undefined1 auVar30 [16];
  int32 wlen;
  int32 id;
  int32 n;
  char buf [1024];
  int32 id_1;
  char tag [1024];
  undefined4 uVar31;
  int local_c6c;
  mdef_t *local_c68;
  uint local_c5c;
  hash_table_t *local_c58;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  char *local_c40;
  undefined4 local_c38;
  byte local_838;
  char cStack_837;
  undefined1 uStack_836;
  int iStack_835;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  
  if (mdeffile == (char *)0x0) {
    pcVar10 = "No mdef-file\n";
    lVar29 = 0x200;
LAB_001364fa:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lVar29,pcVar10);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x203,"Reading model definition: %s\n",mdeffile);
    }
    pmVar9 = (mdef_t *)
             __ckd_calloc__(1,0x60,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x205);
    __stream = fopen(mdeffile,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                     ,0x208,"Failed to open mdef file \'%s\' for reading",mdeffile);
      goto LAB_001364dd;
    }
    do {
      pcVar10 = fgets((char *)&local_c38,0x400,__stream);
      if (pcVar10 == (char *)0x0) break;
    } while ((char)local_c38 == '#');
    if (pcVar10 == (char *)0x0) {
      pcVar10 = "Empty file: %s\n";
      lVar29 = 0x20b;
    }
    else {
      if ((local_c38 == 0x46444d42) || (local_c38 == 0x424d4446)) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x210,"Found byte-order mark %.4s, assuming this is a binary mdef file\n",
                &local_c38);
        fclose(__stream);
        ckd_free(pmVar9);
        return (mdef_t *)0x0;
      }
      local_c58 = (hash_table_t *)mdeffile;
      if (local_c38._2_1_ != '3' || (short)local_c38 != 0x2e30) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x217,"Version error: Expecting %s, but read %s\n","0.3",&local_c38);
        goto LAB_001364dd;
      }
      pmVar9->n_ci_sen = -1;
      pmVar9->n_sen = -1;
      pmVar9->n_tmat = -1;
      uVar28 = 0xffffffff;
      uVar26 = 0xffffffff;
      uVar22 = 0xffffffff;
      local_c68 = pmVar9;
LAB_00135ab6:
      do {
        do {
          pcVar10 = fgets((char *)&local_c38,0x400,__stream);
          if (pcVar10 != (char *)0x0) {
            if ((char)local_c38 == '#') goto LAB_00135ab6;
          }
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "Incomplete header\n";
            lVar29 = 0x222;
            goto LAB_001364fa;
          }
          iVar6 = __isoc99_sscanf(&local_c38,"%d %s",&local_c44,&local_438);
          pmVar9 = local_c68;
          if ((iVar6 != 2) || ((int)local_c44 < 0)) {
            pcVar10 = "Error in header: %s\n";
            mdeffile = (char *)&local_c38;
            lVar29 = 0x225;
            goto LAB_001364d6;
          }
          size = local_c44;
          uVar27 = uVar26;
          uVar23 = uVar22;
          if (((CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) !=
                0x657361 ||
                CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) !=
                0x61625f6e) &&
              (size = uVar28, uVar27 = local_c44,
              CONCAT11(cStack_433,cStack_434) != 0x69 ||
              CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) != 0x72745f6e
              )) && (uVar27 = uVar26, uVar23 = local_c44,
                    CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                    0x70616d ||
                    CONCAT17(cStack_431,
                             CONCAT16(cStack_432,
                                      CONCAT15(cStack_433,
                                               CONCAT14(cStack_434,
                                                        CONCAT13(cStack_435,
                                                                 CONCAT12(cStack_436,
                                                                          CONCAT11(cStack_437,
                                                                                   local_438)))))))
                    != 0x5f65746174735f6e)) {
            auVar30[0] = -(local_438 == 'n');
            auVar30[1] = -(cStack_437 == '_');
            auVar30[2] = -(cStack_436 == 't');
            auVar30[3] = -(cStack_435 == 'i');
            auVar30[4] = -(cStack_434 == 'e');
            auVar30[5] = -(cStack_433 == 'd');
            auVar30[6] = -(cStack_432 == '_');
            auVar30[7] = -(cStack_431 == 'c');
            auVar30[8] = -(cStack_430 == 'i');
            auVar30[9] = -(cStack_42f == '_');
            auVar30[10] = -(cStack_42e == 's');
            auVar30[0xb] = -(cStack_42d == 't');
            auVar30[0xc] = -(cStack_42c == 'a');
            auVar30[0xd] = -(cStack_42b == 't');
            auVar30[0xe] = -(cStack_42a == 'e');
            auVar30[0xf] = -(cStack_429 == '\0');
            if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
              local_c68->n_ci_sen = local_c44;
              uVar23 = uVar22;
            }
            else if (CONCAT17(cStack_42c,
                              CONCAT16(cStack_42d,
                                       CONCAT15(cStack_42e,
                                                CONCAT14(cStack_42f,
                                                         CONCAT13(cStack_430,
                                                                  CONCAT12(cStack_431,
                                                                           CONCAT11(cStack_432,
                                                                                    cStack_433))))))
                             ) == 0x65746174735f64 &&
                     CONCAT17(cStack_431,
                              CONCAT16(cStack_432,
                                       CONCAT15(cStack_433,
                                                CONCAT14(cStack_434,
                                                         CONCAT13(cStack_435,
                                                                  CONCAT12(cStack_436,
                                                                           CONCAT11(cStack_437,
                                                                                    local_438)))))))
                     == 0x735f646569745f6e) {
              local_c68->n_sen = local_c44;
              uVar23 = uVar22;
            }
            else {
              if (CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                  0x74616d ||
                  CONCAT17(cStack_431,
                           CONCAT16(cStack_432,
                                    CONCAT15(cStack_433,
                                             CONCAT14(cStack_434,
                                                      CONCAT13(cStack_435,
                                                               CONCAT12(cStack_436,
                                                                        CONCAT11(cStack_437,
                                                                                 local_438))))))) !=
                  0x745f646569745f6e) {
                pcVar10 = "Unknown header line: %s\n";
                mdeffile = (char *)&local_c38;
                lVar29 = 0x234;
                goto LAB_001364d6;
              }
              local_c68->n_tmat = local_c44;
              uVar23 = uVar22;
            }
          }
          uVar28 = size;
          uVar26 = uVar27;
          uVar22 = uVar23;
        } while (((int)(size | uVar27 | uVar23) < 0) || (iVar6 = local_c68->n_ci_sen, iVar6 < 0));
        uVar1 = local_c68->n_sen;
        uVar21 = (ulong)uVar1;
      } while (((int)uVar1 < 0) || (iVar8 = local_c68->n_tmat, iVar8 < 0));
      if ((((iVar6 <= (int)uVar1) && (size != 0)) && (iVar6 != 0)) && (iVar8 != 0)) {
        if ((int)size < 0x7fff) {
          uVar27 = uVar27 + size;
          if (uVar27 < 0x7fffffff) {
            if ((int)uVar1 < 0x7fff) {
              local_c4c = size;
              if (iVar8 != 0x7fffffff) {
                local_c68->n_emit_state = uVar23 / uVar27 - 1;
                if ((uVar23 / uVar27) * uVar27 == uVar23) {
                  local_c68->n_ciphone = size;
                  phVar11 = hash_table_new(size,0);
                  pmVar9->ciphone_ht = phVar11;
                  local_c40 = (char *)(ulong)size;
                  pcVar12 = (ciphone_t *)
                            __ckd_calloc__((size_t)(ulong)size,0x10,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                           ,0x252);
                  pmVar9->ciphone = pcVar12;
                  pmVar9->n_phone = uVar27;
                  ppVar13 = (phone_t *)
                            __ckd_calloc__((ulong)uVar27,0x14,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                           ,0x256);
                  pmVar9->phone = ppVar13;
                  ppuVar14 = (uint16 **)
                             __ckd_calloc_2d__((long)pmVar9->n_phone,(long)pmVar9->n_emit_state,2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                               ,0x259);
                  pmVar9->sseq = ppuVar14;
                  ppppVar15 = (ph_lc_t ***)
                              __ckd_calloc_2d__(4,(long)pmVar9->n_ciphone,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                ,0x25d);
                  pmVar9->wpos_ci_lclist = ppppVar15;
                  pcVar10 = (char *)0x0;
                  if (0 < (int)size) {
                    pcVar10 = (char *)0x0;
LAB_00135d89:
                    do {
                      pcVar16 = fgets((char *)&local_c38,0x400,__stream);
                      if (pcVar16 != (char *)0x0) {
                        if ((char)local_c38 == '#') goto LAB_00135d89;
                      }
                      if (pcVar16 == (char *)0x0) {
                        pcVar16 = "Premature EOF reading CIphone %d\n";
                        lVar29 = 0x267;
                        goto LAB_001366cd;
                      }
                      iVar6 = __isoc99_sscanf(&local_c38,"%s%n",&local_838,&local_c6c);
                      if (iVar6 != 1) {
                        pcVar10 = "Missing base phone name: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x146;
                        goto LAB_001364d6;
                      }
                      lVar29 = (long)local_c6c;
                      iVar7 = hash_table_lookup_int32
                                        (pmVar9->ciphone_ht,(char *)&local_838,(int32 *)&local_c5c);
                      if ((-1 < iVar7) && (-1 < (int)local_c5c)) {
                        pcVar10 = "Duplicate base phone: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x14c;
                        goto LAB_001364d6;
                      }
                      if ((long)pmVar9->n_ciphone <= (long)pcVar10) {
                        __assert_fail("p < m->n_ciphone",
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                      ,0x65,"void ciphone_add(mdef_t *, char *, int)");
                      }
                      pcVar16 = __ckd_salloc__((char *)&local_838,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                               ,0x67);
                      pmVar9->ciphone[(long)pcVar10].name = pcVar16;
                      pcVar16 = (char *)hash_table_enter(pmVar9->ciphone_ht,pcVar16,pcVar10);
                      local_c58 = (hash_table_t *)pcVar10;
                      if (pcVar16 != pcVar10) {
                        mdeffile = local_c68->ciphone[(long)pcVar10].name;
                        pcVar10 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                        lVar29 = 0x6b;
                        goto LAB_001364d6;
                      }
                      lVar29 = (long)&local_c38 + lVar29;
                      iVar6 = 3;
                      do {
                        iVar8 = __isoc99_sscanf(lVar29,"%s%n",&local_838,&local_c6c);
                        if ((iVar8 != 1) || (CONCAT11(cStack_837,local_838) != 0x2d)) {
                          pcVar10 = "Bad context info for base phone: %s\n";
                          mdeffile = (char *)&local_c38;
                          lVar29 = 0x156;
                          goto LAB_001364d6;
                        }
                        lVar29 = lVar29 + local_c6c;
                        iVar6 = iVar6 + -1;
                      } while (iVar6 != 0);
                      iVar6 = __isoc99_sscanf(lVar29,"%s%n",&local_838,&local_c6c);
                      phVar11 = local_c58;
                      pmVar9 = local_c68;
                      if (iVar6 != 1) {
                        pcVar10 = "Missing filler attribute field: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x15c;
                        goto LAB_001364d6;
                      }
                      lVar17 = (long)local_c6c;
                      if (iStack_835 == 0x72656c &&
                          CONCAT13((undefined1)iStack_835,
                                   CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) ==
                          0x6c6c6966) {
                        iVar7 = 1;
                      }
                      else {
                        iVar7 = 0;
                        if (CONCAT13((undefined1)iStack_835,
                                     CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) !=
                            0x612f6e) {
                          pcVar10 = "Bad filler attribute field: %s\n";
                          mdeffile = (char *)&local_c38;
                          lVar29 = 0x163;
                          goto LAB_001364d6;
                        }
                      }
                      local_c68->ciphone[(long)pcVar10].filler = iVar7;
                      iVar6 = (int)local_c58;
                      triphone_add(local_c68,iVar6,-1,-1,WORD_POSN_UNDEFINED,iVar6);
                      parse_tmat_senmap(pmVar9,(char *)&local_c38,
                                        (lVar29 + lVar17) - (long)&local_c38,iVar6);
                      pcVar10 = (char *)((long)phVar11 + 1);
                    } while (pcVar10 != local_c40);
                  }
                  iVar7 = hash_table_lookup_int32(pmVar9->ciphone_ht,"SIL",(int32 *)&local_838);
                  iVar20 = -1;
                  if (-1 < iVar7) {
                    iVar20 = CONCAT11(cStack_837,local_838);
                  }
                  pmVar9->sil = iVar20;
                  if ((int)pcVar10 < pmVar9->n_phone) {
LAB_00135f89:
                    do {
                      pcVar16 = fgets((char *)&local_c38,0x400,__stream);
                      if (pcVar16 != (char *)0x0) {
                        if ((char)local_c38 == '#') goto LAB_00135f89;
                      }
                      if (pcVar16 == (char *)0x0) {
                        pcVar16 = "Premature EOF reading phone %d\n";
                        lVar29 = 0x26f;
LAB_001366cd:
                        err_msg(ERR_FATAL,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                ,lVar29,pcVar16,(ulong)pcVar10 & 0xffffffff);
                        goto LAB_001364dd;
                      }
                      local_c58 = (hash_table_t *)pcVar10;
                      iVar6 = __isoc99_sscanf(&local_c38,"%s%n",&local_838,&local_c6c);
                      if (iVar6 != 1) {
                        pcVar10 = "Missing base phone name: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x178;
                        goto LAB_001364d6;
                      }
                      lVar29 = (long)local_c6c;
                      iVar7 = hash_table_lookup_int32
                                        (pmVar9->ciphone_ht,(char *)&local_838,(int32 *)&local_c5c);
                      uVar28 = 0xffffffff;
                      if (-1 < iVar7) {
                        uVar28 = local_c5c;
                      }
                      if ((int)uVar28 < 0) {
                        pcVar10 = "Unknown base phone: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x17d;
                        goto LAB_001364d6;
                      }
                      iVar6 = __isoc99_sscanf((long)&local_c38 + lVar29,"%s%n",&local_838,&local_c6c
                                             );
                      if (iVar6 != 1) {
                        pcVar10 = "Missing left context: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x181;
                        goto LAB_001364d6;
                      }
                      lVar17 = (long)local_c6c;
                      iVar7 = hash_table_lookup_int32
                                        (local_c68->ciphone_ht,(char *)&local_838,
                                         (int32 *)&local_c5c);
                      local_c48 = 0xffffffff;
                      if (-1 < iVar7) {
                        local_c48 = local_c5c;
                      }
                      if ((int)local_c48 < 0) {
                        pcVar10 = "Unknown left context: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x185;
                        goto LAB_001364d6;
                      }
                      lVar17 = (long)&local_c38 + lVar29 + lVar17;
                      iVar6 = __isoc99_sscanf(lVar17,"%s%n",&local_838,&local_c6c);
                      if (iVar6 != 1) {
                        pcVar10 = "Missing right context: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x189;
                        goto LAB_001364d6;
                      }
                      lVar29 = (long)local_c6c;
                      iVar7 = hash_table_lookup_int32
                                        (local_c68->ciphone_ht,(char *)&local_838,
                                         (int32 *)&local_c5c);
                      uVar26 = 0xffffffff;
                      if (-1 < iVar7) {
                        uVar26 = local_c5c;
                      }
                      if ((int)uVar26 < 0) {
                        pcVar10 = "Unknown right  context: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x18d;
                        goto LAB_001364d6;
                      }
                      lVar17 = lVar17 + lVar29;
                      iVar6 = __isoc99_sscanf(lVar17,"%s%n",&local_838,&local_c6c);
                      if ((iVar6 != 1) || (cStack_837 != '\0')) {
                        pcVar10 = "Missing or bad word-position spec: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x191;
                        goto LAB_001364d6;
                      }
                      if (local_838 < 0x69) {
                        wpos = WORD_POSN_BEGIN;
                        if (local_838 != 0x62) {
                          if (local_838 != 0x65) {
LAB_0013671b:
                            pcVar10 = "Bad word-position spec: %s\n";
                            mdeffile = (char *)&local_c38;
                            lVar29 = 0x1a1;
                            goto LAB_001364d6;
                          }
                          wpos = WORD_POSN_END;
                        }
                      }
                      else if (local_838 == 0x69) {
                        wpos = WORD_POSN_INTERNAL;
                      }
                      else {
                        if (local_838 != 0x73) goto LAB_0013671b;
                        wpos = WORD_POSN_SINGLE;
                      }
                      lVar17 = lVar17 + local_c6c;
                      iVar6 = __isoc99_sscanf(lVar17,"%s%n",&local_838,&local_c6c);
                      pmVar9 = local_c68;
                      if (iVar6 != 1) {
                        pcVar10 = "Missing filler attribute field: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x1a6;
                        goto LAB_001364d6;
                      }
                      lVar29 = (long)local_c6c;
                      if (((iStack_835 != 0x72656c ||
                            CONCAT13((undefined1)iStack_835,
                                     CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) !=
                            0x6c6c6966) || (local_c68->ciphone[uVar28].filler == 0)) &&
                         ((CONCAT13((undefined1)iStack_835,
                                    CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) != 0x612f6e
                          || (local_c68->ciphone[uVar28].filler != 0)))) {
                        pcVar10 = "Bad filler attribute field: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar29 = 0x1ad;
                        goto LAB_001364d6;
                      }
                      iVar6 = (int)local_c58;
                      triphone_add(local_c68,uVar28,local_c48,uVar26,wpos,iVar6);
                      parse_tmat_senmap(pmVar9,(char *)&local_c38,
                                        (lVar17 + lVar29) - (long)&local_c38,iVar6);
                      pcVar10 = (char *)(ulong)(iVar6 + 1U);
                    } while ((int)(iVar6 + 1U) < pmVar9->n_phone);
                  }
                  do {
                    pcVar16 = fgets((char *)&local_c38,0x400,__stream);
                    pcVar10 = local_c40;
                    if (pcVar16 == (char *)0x0) break;
                  } while ((char)local_c38 == '#');
                  if (pcVar16 != (char *)0x0) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                            ,0x275,"Non-empty file beyond expected #phones (%d)\n",
                            (ulong)(uint)pmVar9->n_phone);
                  }
                  if (pmVar9->n_emit_state * pmVar9->n_ciphone == pmVar9->n_ci_sen) {
                    piVar18 = (int16 *)__ckd_calloc__((long)pmVar9->n_sen,2,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27c);
                    pmVar9->cd2cisen = piVar18;
                    piVar18 = (int16 *)__ckd_calloc__((long)pmVar9->n_sen,2,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27e);
                    pmVar9->sen2cimap = piVar18;
                    if (0 < pmVar9->n_sen) {
                      memset(piVar18,0xff,(ulong)(uint)pmVar9->n_sen * 2);
                    }
                    iVar6 = pmVar9->n_ci_sen;
                    if (0 < (long)iVar6) {
                      piVar2 = pmVar9->cd2cisen;
                      iVar8 = pmVar9->n_emit_state;
                      uVar21 = 0;
                      do {
                        piVar2[uVar21] = (int16)uVar21;
                        piVar18[uVar21] =
                             (int16)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 |
                                           uVar21 & 0xffffffff) / (long)iVar8);
                        uVar21 = uVar21 + 1;
                      } while ((long)iVar6 != uVar21);
                    }
                    iVar6 = pmVar9->n_phone;
                    if ((int)local_c4c < iVar6) {
                      uVar28 = pmVar9->n_emit_state;
                      do {
                        if (0 < (int)uVar28) {
                          ppuVar14 = pmVar9->sseq;
                          puVar3 = ppuVar14[(long)pcVar10];
                          piVar24 = &pmVar9->phone[(long)pcVar10].ci;
                          piVar2 = pmVar9->cd2cisen;
                          uVar21 = 0;
                          do {
                            uVar25 = (ulong)((uint)puVar3[uVar21] * 2);
                            *(uint16 *)((long)piVar2 + uVar25) = ppuVar14[*piVar24][uVar21];
                            *(int16 *)((long)piVar18 + uVar25) = *piVar24;
                            uVar21 = uVar21 + 1;
                          } while (uVar28 != uVar21);
                        }
                        pcVar10 = pcVar10 + 1;
                      } while ((int)pcVar10 < iVar6);
                    }
                    iVar8 = pmVar9->n_emit_state;
                    uVar28 = 0;
                    local_c58 = hash_table_new(iVar6,0);
                    len = (size_t)(iVar8 * 2);
                    if (0 < pmVar9->n_phone) {
                      lVar17 = 0;
                      lVar29 = 0;
                      val = (void *)0x0;
                      do {
                        pvVar19 = hash_table_enter_bkey
                                            (local_c58,(char *)pmVar9->sseq[lVar29],len,val);
                        local_838 = (byte)pvVar19;
                        cStack_837 = (char)((ulong)pvVar19 >> 8);
                        uStack_836 = (undefined1)((ulong)pvVar19 >> 0x10);
                        iStack_835._0_1_ = (undefined1)((ulong)pvVar19 >> 0x18);
                        uVar28 = (int)val + (uint)((int)val == (int)pvVar19);
                        val = (void *)(ulong)uVar28;
                        *(int *)((long)&pmVar9->phone->ssid + lVar17) = (int)pvVar19;
                        lVar29 = lVar29 + 1;
                        lVar17 = lVar17 + 0x14;
                      } while (lVar29 < pmVar9->n_phone);
                    }
                    ppuVar14 = (uint16 **)
                               __ckd_calloc_2d__((long)(int)uVar28,(long)pmVar9->n_emit_state,2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                 ,0x1d1);
                    g = hash_table_tolist(local_c58,(int32 *)&local_838);
                    pgVar5 = g;
                    if (CONCAT13((undefined1)iStack_835,
                                 CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) == uVar28) {
                      for (; pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
                        uVar4 = *(undefined8 *)((long)(pgVar5->data).ptr + 0x10);
                        local_838 = (byte)uVar4;
                        cStack_837 = (char)((ulong)uVar4 >> 8);
                        uStack_836 = (undefined1)((ulong)uVar4 >> 0x10);
                        iStack_835._1_3_ = (undefined3)((uint)iStack_835 >> 8);
                        iStack_835._0_1_ = (undefined1)((ulong)uVar4 >> 0x18);
                        memcpy(ppuVar14[(int)uVar4],*(pgVar5->data).ptr,len);
                      }
                      glist_free(g);
                      pmVar9 = local_c68;
                      ckd_free_2d(local_c68->sseq);
                      pmVar9->sseq = ppuVar14;
                      pmVar9->n_sseq = uVar28;
                      hash_table_free(local_c58);
                      fclose(__stream);
                      return pmVar9;
                    }
                    __assert_fail("j == n_sseq",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                  ,0x1d4,"void sseq_compress(mdef_t *)");
                  }
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                          ,0x27b,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                          (ulong)(uint)pmVar9->n_ci_sen,(ulong)(uint)pmVar9->n_ciphone,
                          pmVar9->n_emit_state);
                  goto LAB_001364dd;
                }
                pcVar10 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
                lVar29 = 0x24d;
                goto LAB_001364fa;
              }
              uVar31 = 0x7fffffff;
              pcVar10 = "%s: #tmats (%d) exceeds limit (%d)\n";
              lVar29 = 0x248;
              uVar21 = 0x7fffffff;
            }
            else {
              uVar31 = 0x7fff;
              pcVar10 = "%s: #senones (%d) exceeds limit (%d)\n";
              lVar29 = 0x245;
            }
          }
          else {
            uVar31 = 0x7fffffff;
            pcVar10 = "%s: #Phones (%d) exceeds limit (%d)\n";
            lVar29 = 0x242;
            uVar21 = (ulong)uVar27;
          }
        }
        else {
          uVar31 = 0x7fff;
          pcVar10 = "%s: #CI phones (%d) exceeds limit (%d)\n";
          lVar29 = 0x23f;
          uVar21 = (ulong)size;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,lVar29,pcVar10,local_c58,uVar21,uVar31);
        goto LAB_001364dd;
      }
      pcVar10 = "%s: Error in header\n";
      lVar29 = 0x23a;
      mdeffile = (char *)local_c58;
    }
LAB_001364d6:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lVar29,pcVar10,mdeffile);
  }
LAB_001364dd:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    __BIGSTACKVARIABLE__ char tag[1024], buf[1024];
    uint16 **senmap;
    int p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open mdef file '%s' for reading", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, "BMDF", 4) == 0 || strncmp(buf, "FDMB", 4) == 0) {
        E_INFO
            ("Found byte-order mark %.4s, assuming this is a binary mdef file\n",
             buf);
        fclose(fp);
        ckd_free(m);
        return NULL;
    }
    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecting %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_INT16)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_INT16);
    if ((int64)n_ci + n_tri >= MAX_INT32)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_INT32);
    if (m->n_sen >= MAX_INT16)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_INT16);
    if (m->n_tmat >= MAX_INT32) /* Comparison is always false... */
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_INT32);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(**senmap));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */

    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->cd2cisen)); /* freed in mdef_free */

    m->sen2cimap = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->sen2cimap)); /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = -1;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[m->phone[p].ci][s];
            m->cd2cisen[cd] = ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}